

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
args::PositionalBase::GetProgramLine_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,PositionalBase *this,HelpParams *params)

{
  size_type *psVar1;
  long *plVar2;
  undefined8 *puVar3;
  long *plVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_81;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (((this->super_NamedBase).super_Base.options & Required) == None) {
    (*(this->super_NamedBase).super_Base._vptr_Base[0x12])(local_40);
    plVar2 = (long *)std::__cxx11::string::replace
                               ((ulong)local_40,0,(char *)0x0,
                                (ulong)(params->proglineNonrequiredOpen)._M_dataplus._M_p);
    local_80 = &local_70;
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_70 = *plVar4;
      lStack_68 = plVar2[3];
    }
    else {
      local_70 = *plVar4;
      local_80 = (long *)*plVar2;
    }
    local_78 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_80,(ulong)(params->proglineNonrequiredClose)._M_dataplus._M_p
                       );
  }
  else {
    (*(this->super_NamedBase).super_Base._vptr_Base[0x12])(local_40);
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)local_40,0,(char *)0x0,
                        (ulong)(params->proglineRequiredOpen)._M_dataplus._M_p);
    local_80 = &local_70;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_70 = *plVar2;
      lStack_68 = puVar3[3];
    }
    else {
      local_70 = *plVar2;
      local_80 = (long *)*puVar3;
    }
    local_78 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_80,(ulong)(params->proglineRequiredClose)._M_dataplus._M_p);
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  psVar1 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_60.field_2._M_allocated_capacity = *psVar1;
    local_60.field_2._8_8_ = puVar3[3];
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar1;
    local_60._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_60._M_string_length = puVar3[1];
  *puVar3 = psVar1;
  puVar3[1] = 0;
  *(undefined1 *)psVar1 = 0;
  __l._M_len = 1;
  __l._M_array = &local_60;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,__l,&local_81);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_80 != &local_70) {
    operator_delete(local_80);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<std::string> GetProgramLine(const HelpParams &params) const override
            {
                return { IsRequired() ? params.proglineRequiredOpen + Name() + params.proglineRequiredClose
                                      : params.proglineNonrequiredOpen + Name() + params.proglineNonrequiredClose };
            }